

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axis_property.c
# Opt level: O1

void mpt_axis_init(mpt_axis *ax,mpt_axis *from)

{
  double dVar1;
  double dVar2;
  uint8_t uVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar6;
  float fVar7;
  int16_t iVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  char *pcVar11;
  
  if (from == (mpt_axis *)0x0) {
    ax->format = '\0';
    ax->dec = '\0';
    ax->lpos = '\0';
    ax->tpos = '\0';
    *(undefined4 *)&ax->field_0x24 = 0;
    ax->end = 1.0;
    ax->tlen = 0.3;
    ax->exp = 0;
    ax->intv = '\0';
    ax->sub = '\0';
    ax->_title = (char *)0x0;
    ax->begin = 0.0;
  }
  else {
    dVar1 = from->begin;
    dVar2 = from->end;
    fVar7 = from->tlen;
    iVar8 = from->exp;
    uVar9 = from->intv;
    uVar10 = from->sub;
    ax->_title = from->_title;
    ax->begin = dVar1;
    uVar3 = from->dec;
    cVar4 = from->lpos;
    cVar5 = from->tpos;
    uVar6 = *(undefined4 *)&from->field_0x24;
    ax->format = from->format;
    ax->dec = uVar3;
    ax->lpos = cVar4;
    ax->tpos = cVar5;
    *(undefined4 *)&ax->field_0x24 = uVar6;
    ax->end = dVar2;
    ax->tlen = fVar7;
    ax->exp = iVar8;
    ax->intv = uVar9;
    ax->sub = uVar10;
    if (ax->_title != (char *)0x0) {
      pcVar11 = strdup(from->_title);
      ax->_title = pcVar11;
    }
  }
  return;
}

Assistant:

extern void mpt_axis_init(MPT_STRUCT(axis) *ax, const MPT_STRUCT(axis) *from)
{
	if (from) {
		*ax = *from;
		
		if (ax->_title) {
			ax->_title = strdup(from->_title);
		}
		return;
	}
	*ax = def_axis;
}